

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushvalue(lua_State *L,int idx)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  int *piVar4;
  TValue *pTVar5;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xf3,"void lua_pushvalue(lua_State *, int)");
  }
  pTVar3 = L->top;
  pTVar5 = index2addr(L,idx);
  pTVar3->value_ = pTVar5->value_;
  uVar1 = pTVar5->tt_;
  pTVar3->tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)((pTVar3->value_).gc)->tt ||
      ((L != (lua_State *)0x0 &&
       ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xf4,"void lua_pushvalue(lua_State *, int)");
  }
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if (L->ci->top < pTVar3 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xf5,"void lua_pushvalue(lua_State *, int)");
  }
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xf6,"void lua_pushvalue(lua_State *, int)");
}

Assistant:

LUA_API void lua_pushvalue (lua_State *L, int idx) {
  lua_lock(L);
  setobj2s(L, L->top, index2addr(L, idx));
  api_incr_top(L);
  lua_unlock(L);
}